

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_start.c
# Opt level: O1

void start(int thread)

{
  pthread_cond_t *ppVar1;
  uint uVar2;
  pthread_t __th;
  int iVar3;
  int iVar4;
  pthread_cond_t *arg;
  void *pvVar5;
  skynet_monitor *psVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  void *__arg;
  __start_routine *__start_routine;
  pthread_cond_t *__newthread;
  pthread_t *ppVar7;
  pthread_t *ppVar8;
  pthread_t *arg_00;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  pthread_cond_t *__cond;
  undefined8 auStack_a0 [5];
  pthread_t apStack_78 [3];
  pthread_cond_t *local_60 [2];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  pthread_t *local_38;
  
  local_50 = (ulong)(thread + 3);
  lVar12 = -(local_50 * 8 + 0xf & 0xfffffffffffffff0);
  ppVar8 = (pthread_t *)((long)apStack_78 + lVar12 + 0x10);
  *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1125f9;
  arg = (pthread_cond_t *)malloc(0x70);
  arg->__align = 0;
  (&arg->__align)[1] = 0;
  (&arg->__align)[0xc] = 0;
  (&arg->__align)[0xd] = 0;
  (&arg->__align)[2] = 0;
  (&arg->__align)[3] = 0;
  (&arg->__align)[4] = 0;
  (&arg->__align)[5] = 0;
  (&arg->__align)[6] = 0;
  (&arg->__align)[7] = 0;
  (&arg->__align)[8] = 0;
  (&arg->__align)[9] = 0;
  (&arg->__align)[10] = 0;
  (&arg->__align)[0xb] = 0;
  (arg->__data).__lock = thread;
  *(undefined4 *)(&arg->__align + 0xd) = 0;
  *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x112637;
  pvVar5 = malloc((long)thread * 8);
  (&arg->__align)[1] = (longlong)pvVar5;
  local_40 = (ulong)(uint)thread;
  if (0 < thread) {
    uVar9 = 0;
    do {
      *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x112651;
      psVar6 = skynet_monitor_new();
      *(skynet_monitor **)((&arg->__align)[1] + uVar9 * 8) = psVar6;
      uVar9 = uVar9 + 1;
    } while ((uint)thread != uVar9);
  }
  ppVar1 = (pthread_cond_t *)(&arg->__align + 8);
  __start_routine = (__start_routine *)0x0;
  *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x11266f;
  __newthread = ppVar1;
  iVar3 = pthread_mutex_init((pthread_mutex_t *)ppVar1,(pthread_mutexattr_t *)0x0);
  if (iVar3 == 0) {
    __cond = (pthread_cond_t *)(&arg->__align + 2);
    __start_routine = (__start_routine *)0x0;
    local_60[0] = __cond;
    local_60[1] = ppVar1;
    local_48 = (ulong)(uint)thread;
    *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x112691;
    __newthread = __cond;
    iVar3 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    if (iVar3 == 0) {
      *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1126ab;
      create_thread(ppVar8,thread_monitor,arg);
      *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1126bf;
      create_thread((pthread_t *)((long)local_60 + lVar12),thread_timer,arg);
      local_38 = ppVar8;
      *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1126d7;
      create_thread((pthread_t *)((long)local_60 + lVar12 + 8),thread_socket,arg);
      ppVar8 = ppVar8 + local_48 * -2;
      if (0 < (int)local_40) {
        ppVar7 = local_38 + 3;
        piVar10 = start::weight;
        uVar9 = 0;
        arg_00 = ppVar8;
        do {
          *arg_00 = (pthread_t)arg;
          *(int *)(arg_00 + 1) = (int)uVar9;
          iVar3 = 0;
          if (uVar9 < 0x20) {
            iVar3 = *piVar10;
          }
          *(int *)((long)arg_00 + 0xc) = iVar3;
          ppVar8[-1] = 0x11272c;
          create_thread(ppVar7,thread_worker,arg_00);
          uVar9 = uVar9 + 1;
          piVar10 = piVar10 + 1;
          arg_00 = arg_00 + 2;
          ppVar7 = ppVar7 + 1;
        } while (local_48 != uVar9);
      }
      ppVar7 = local_38;
      if (-3 < (int)local_40) {
        uVar9 = 1;
        if (1 < (int)local_50) {
          uVar9 = local_50 & 0xffffffff;
        }
        uVar11 = 0;
        do {
          __th = ppVar7[uVar11];
          ppVar8[-1] = 0x11276a;
          pthread_join(__th,(void **)0x0);
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      iVar3 = (arg->__data).__lock;
      if (0 < (long)iVar3) {
        lVar12 = 0;
        do {
          psVar6 = *(skynet_monitor **)((&arg->__align)[1] + lVar12 * 8);
          ppVar8[-1] = 0x11278a;
          skynet_monitor_delete(psVar6);
          lVar12 = lVar12 + 1;
        } while (iVar3 != lVar12);
      }
      ppVar1 = local_60[1];
      ppVar8[-1] = 0x11279b;
      pthread_mutex_destroy((pthread_mutex_t *)ppVar1);
      ppVar1 = local_60[0];
      ppVar8[-1] = 0x1127a4;
      pthread_cond_destroy(ppVar1);
      pvVar5 = (void *)(&arg->__align)[1];
      ppVar8[-1] = 0x1127ad;
      free(pvVar5);
      ppVar8[-1] = 0x1127b5;
      free(arg);
      return;
    }
  }
  else {
    *(undefined8 *)((long)apStack_78 + lVar12 + 8) = 0x1127c9;
    start_cold_1();
    __cond = arg;
  }
  *(code **)((long)apStack_78 + lVar12 + 8) = create_thread;
  start_cold_2();
  *(undefined8 *)((long)apStack_78 + lVar12 + 8) = extraout_RAX;
  *(undefined8 *)((long)apStack_78 + lVar12) = 0x1127dc;
  iVar3 = pthread_create((pthread_t *)&__newthread->__align,(pthread_attr_t *)0x0,__start_routine,
                         __arg);
  if (iVar3 == 0) {
    return;
  }
  *(code **)((long)apStack_78 + lVar12) = thread_monitor;
  create_thread_cold_1();
  *(undefined1 **)((long)apStack_78 + lVar12) = &stack0xfffffffffffffff8;
  *(pthread_cond_t **)((long)auStack_a0 + lVar12 + 0x20) = __cond;
  *(pthread_cond_t **)((long)auStack_a0 + lVar12 + 0x18) = ppVar1;
  *(pthread_cond_t **)((long)auStack_a0 + lVar12 + 0x10) = arg;
  *(undefined8 *)((long)auStack_a0 + lVar12 + 8) = extraout_RAX_00;
  uVar2 = (__newthread->__data).__lock;
  *(undefined8 *)((long)auStack_a0 + lVar12) = 0x1127fe;
  skynet_initthread(4);
  do {
    *(undefined8 *)((long)auStack_a0 + lVar12) = 0x112805;
    iVar3 = skynet_context_total();
    if (iVar3 == 0) {
      return;
    }
    if (0 < (int)uVar2) {
      uVar9 = 0;
      do {
        psVar6 = *(skynet_monitor **)((__newthread->__data).__total_seq + uVar9 * 8);
        *(undefined8 *)((long)auStack_a0 + lVar12) = 0x11281e;
        skynet_monitor_check(psVar6);
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
    iVar3 = 5;
    do {
      *(undefined8 *)((long)auStack_a0 + lVar12) = 0x112832;
      iVar4 = skynet_context_total();
      if (iVar4 == 0) break;
      *(undefined8 *)((long)auStack_a0 + lVar12) = 0x112840;
      sleep(1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  } while( true );
}

Assistant:

static void
start(int thread) {
	pthread_t pid[thread+3];

	struct monitor *m = skynet_malloc(sizeof(*m));
	memset(m, 0, sizeof(*m));
	m->count = thread;
	m->sleep = 0;

	m->m = skynet_malloc(thread * sizeof(struct skynet_monitor *));
	int i;
	for (i=0;i<thread;i++) {
		m->m[i] = skynet_monitor_new();
	}
	if (pthread_mutex_init(&m->mutex, NULL)) {
		fprintf(stderr, "Init mutex error");
		exit(1);
	}
	if (pthread_cond_init(&m->cond, NULL)) {
		fprintf(stderr, "Init cond error");
		exit(1);
	}

	create_thread(&pid[0], thread_monitor, m);
	create_thread(&pid[1], thread_timer, m);
	create_thread(&pid[2], thread_socket, m);

	static int weight[] = { 
		-1, -1, -1, -1, 0, 0, 0, 0,
		1, 1, 1, 1, 1, 1, 1, 1, 
		2, 2, 2, 2, 2, 2, 2, 2, 
		3, 3, 3, 3, 3, 3, 3, 3, };
	struct worker_parm wp[thread];
	for (i=0;i<thread;i++) {
		wp[i].m = m;
		wp[i].id = i;
		if (i < sizeof(weight)/sizeof(weight[0])) {
			wp[i].weight= weight[i];
		} else {
			wp[i].weight = 0;
		}
		create_thread(&pid[i+3], thread_worker, &wp[i]);
	}

	for (i=0;i<thread+3;i++) {
		pthread_join(pid[i], NULL); 
	}

	free_monitor(m);
}